

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_LOOPCALL(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  TT_DefArray pTVar2;
  TT_CallStack pTVar3;
  bool bVar4;
  TT_DefRecord *limit;
  TT_DefRecord *def;
  TT_CallRec *pCrec;
  FT_ULong F;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = args[1];
  if (uVar1 < exc->maxFunc + 1) {
    limit = exc->FDefs + uVar1;
    if ((exc->maxFunc + 1 != exc->numFDefs) || (limit->opc != uVar1)) {
      limit = exc->FDefs;
      pTVar2 = limit + exc->numFDefs;
      while( true ) {
        bVar4 = false;
        if (limit < pTVar2) {
          bVar4 = limit->opc != uVar1;
        }
        if (!bVar4) break;
        limit = limit + 1;
      }
      if (limit == pTVar2) goto LAB_00333fa4;
    }
    if (limit->active != '\0') {
      if (exc->callSize <= exc->callTop) {
        exc->error = 0x82;
        return;
      }
      if (*args < 1) {
        return;
      }
      pTVar3 = exc->callStack + exc->callTop;
      pTVar3->Caller_Range = exc->curRange;
      pTVar3->Caller_IP = exc->IP + 1;
      pTVar3->Cur_Count = (long)(int)*args;
      pTVar3->Def = limit;
      exc->callTop = exc->callTop + 1;
      Ins_Goto_CodeRange(exc,limit->range,limit->start);
      exc->step_ins = '\0';
      exc->loopcall_counter = *args + exc->loopcall_counter;
      if (exc->loopcall_counter <= exc->loopcall_counter_max) {
        return;
      }
      exc->error = 0x8b;
      return;
    }
  }
LAB_00333fa4:
  exc->error = 0x86;
  return;
}

Assistant:

static void
  Ins_LOOPCALL( TT_ExecContext  exc,
                FT_Long*        args )
  {
    FT_ULong       F;
    TT_CallRec*    pCrec;
    TT_DefRecord*  def;


    /* first of all, check the index */
    F = (FT_ULong)args[1];
    if ( BOUNDSL( F, exc->maxFunc + 1 ) )
      goto Fail;

    /* Except for some old Apple fonts, all functions in a TrueType */
    /* font are defined in increasing order, starting from 0.  This */
    /* means that we normally have                                  */
    /*                                                              */
    /*    exc->maxFunc+1 == exc->numFDefs                           */
    /*    exc->FDefs[n].opc == n for n in 0..exc->maxFunc           */
    /*                                                              */
    /* If this isn't true, we need to look up the function table.   */

    def = exc->FDefs + F;
    if ( exc->maxFunc + 1 != exc->numFDefs || def->opc != F )
    {
      /* look up the FDefs table */
      TT_DefRecord*  limit;


      def   = exc->FDefs;
      limit = def + exc->numFDefs;

      while ( def < limit && def->opc != F )
        def++;

      if ( def == limit )
        goto Fail;
    }

    /* check that the function is active */
    if ( !def->active )
      goto Fail;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                         &&
         exc->ignore_x_mode                                  &&
         ( def->sph_fdef_flags & SPH_FDEF_VACUFORM_ROUND_1 ) )
      goto Fail;
    else
      exc->sph_in_func_flags = def->sph_fdef_flags;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    /* check stack */
    if ( exc->callTop >= exc->callSize )
    {
      exc->error = FT_THROW( Stack_Overflow );
      return;
    }

    if ( args[0] > 0 )
    {
      pCrec = exc->callStack + exc->callTop;

      pCrec->Caller_Range = exc->curRange;
      pCrec->Caller_IP    = exc->IP + 1;
      pCrec->Cur_Count    = (FT_Int)args[0];
      pCrec->Def          = def;

      exc->callTop++;

      Ins_Goto_CodeRange( exc, def->range, def->start );

      exc->step_ins = FALSE;

      exc->loopcall_counter += (FT_ULong)args[0];
      if ( exc->loopcall_counter > exc->loopcall_counter_max )
        exc->error = FT_THROW( Execution_Too_Long );
    }

    return;

  Fail:
    exc->error = FT_THROW( Invalid_Reference );
  }